

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::fresnel::schlick::eval(schlick *this,float_t zd)

{
  float *extraout_RDX;
  long in_RSI;
  value_type vVar1;
  _Expr<std::__detail::_BinClos<std::__plus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>,_float>
  local_28;
  
  if ((0.0 <= zd) && (zd <= 1.0)) {
    local_28._M_closure.
    super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr1 = 1.0 - zd;
    local_28._M_closure.
    super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr1 = local_28._M_closure.
                super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
                ._M_expr2.
                super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
                ._M_expr1 *
                local_28._M_closure.
                super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
                ._M_expr2.
                super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
                ._M_expr1 *
                local_28._M_closure.
                super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
                ._M_expr2.
                super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
                ._M_expr1 *
                local_28._M_closure.
                super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
                ._M_expr2.
                super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
                ._M_expr1 *
                local_28._M_closure.
                super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
                ._M_expr2.
                super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
                ._M_expr1;
    local_28._M_closure.
    super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr1 = (__type)(in_RSI + 8);
    local_28._M_closure.
    super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr2.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr1 = 1.0;
    local_28._M_closure.
    super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
    ._M_expr2.
    super__BinBase1<std::__multiplies,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>
    ._M_expr2.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr2 =
         local_28._M_closure.
         super__BinBase<std::__plus,_std::valarray<float>,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>
         ._M_expr1;
    std::valarray<float>::
    valarray<std::__detail::_BinClos<std::__plus,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__multiplies,std::_Constant,std::_Expr,float,std::__detail::_BinClos<std::__minus,std::_Constant,std::_ValArray,float,float>>>>
              ((valarray<float> *)this,&local_28);
    vVar1._M_data = extraout_RDX;
    vVar1._M_size = (size_t)this;
    return vVar1;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x483,"virtual brdf::value_type djb::fresnel::schlick::eval(float_t) const");
}

Assistant:

brdf::value_type schlick::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	float_t c1 = 1 - zd;
	float_t c2 = c1 * c1;
	float_t c5 = c2 * c2 * c1;

	return f0 + c5 * ((float_t)1 - f0);
}